

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall MidiSimulationDataGenerator::injectBurstErrors(MidiSimulationDataGenerator *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float probability;
  int r;
  U64 currentSample;
  int numSamplesToOverwrite;
  U32 samples_per_bit;
  int startingSample;
  MidiSimulationDataGenerator *this_local;
  
  iVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  uVar1 = this->mSimulationSampleRateHz;
  uVar2 = this->mSettings->mBitRate;
  srand(1);
  for (_probability = (ulong)iVar3; _probability < (ulong)(long)(int)(iVar3 + (uVar1 / uVar2) * 0xd)
      ; _probability = _probability + 1) {
    SimulationChannelDescriptor::Advance((int)this + 0x10);
    iVar4 = rand();
    if ((float)iVar4 < 4.2949674e+08) {
      SimulationChannelDescriptor::Transition();
    }
  }
  return;
}

Assistant:

void MidiSimulationDataGenerator::injectBurstErrors()
{
    // This function adds random transitions while advancing the stream.
    // Pseudocode Example:
    // write numSamplesToOverwrite samples of garbage.
    // done.

    const int startingSample = mMidiSimulationData.GetCurrentSampleNumber();
    U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;
    const int numSamplesToOverwrite = 13 * samples_per_bit;
    U64 currentSample = startingSample;
    int r;
    float probability = 0.2f;
    srand( 1 ); // Default seed, will produce repeatable sequences.
    while( currentSample < ( startingSample + numSamplesToOverwrite ) )
    {
        mMidiSimulationData.Advance( 1 );
        r = rand();
        if( ( float )r < ( ( float )RAND_MAX * probability ) )
        {
            mMidiSimulationData.Transition(); //
        }
        currentSample++;
    }
}